

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_fast(char *source,char *dest,int originalSize)

{
  byte *pbVar1;
  byte bVar2;
  undefined8 uVar3;
  ushort uVar4;
  BYTE *s_2;
  byte *pbVar5;
  U32 length_2;
  uint uVar6;
  ushort uVar7;
  int iVar8;
  ulong uVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  U32 length;
  byte *pbVar17;
  BYTE *d_1;
  size_t __n;
  ushort *puVar18;
  ushort *puVar19;
  BYTE *d;
  byte *pbVar20;
  byte *local_38;
  
  if (source == (char *)0x0) {
    uVar6 = 0xffffffff;
  }
  else if (originalSize == 0) {
    uVar6 = -(uint)(*source != '\0') | 1;
  }
  else {
    pbVar1 = (byte *)(dest + originalSize);
    pbVar17 = (byte *)(dest + (long)originalSize + -8);
    pbVar14 = (byte *)(dest + (long)originalSize + -0x1a);
    iVar11 = (int)source;
    if (0x3f < originalSize) {
LAB_00112e3c:
      while( true ) {
        while( true ) {
          bVar2 = (byte)*(ushort *)source;
          uVar12 = (uint)bVar2;
          uVar6 = (uint)(bVar2 >> 4);
          if (uVar6 == 0xf) {
            uVar6 = 0;
            puVar19 = (ushort *)((long)source + 0x10);
            do {
              puVar18 = puVar19;
              uVar6 = uVar6 + *(byte *)((long)puVar18 + -0xf);
              puVar19 = (ushort *)((long)puVar18 + 1);
            } while (*(byte *)((long)puVar18 + -0xf) == 0xff);
            uVar9 = (ulong)uVar6;
            pbVar20 = (byte *)dest + uVar9 + 0xf;
            if (pbVar17 < pbVar20) {
              __n = uVar9 + 0xf;
              source = (char *)(puVar18 + -7);
              goto LAB_00113104;
            }
            puVar19 = puVar18 + -7;
            do {
              *(undefined8 *)dest = *(undefined8 *)puVar19;
              dest = (char *)((byte *)dest + 8);
              puVar19 = puVar19 + 4;
            } while (dest < pbVar20);
            puVar19 = (ushort *)((long)puVar18 + 1 + uVar9);
          }
          else {
            *(undefined8 *)dest = *(undefined8 *)((long)source + 1);
            if (0x8f < bVar2) {
              *(undefined8 *)((byte *)dest + 8) = *(undefined8 *)((long)source + 9);
            }
            pbVar20 = (byte *)dest + uVar6;
            puVar19 = (ushort *)((byte *)((long)source + 1) + uVar6);
          }
          uVar7 = *puVar19;
          uVar9 = (ulong)uVar7;
          source = (char *)(puVar19 + 1);
          pbVar15 = pbVar20 + -uVar9;
          uVar13 = (ulong)(bVar2 & 0xf);
          if (uVar13 == 0xf) break;
          dest = (char *)(pbVar20 + uVar13 + 4);
          uVar13 = uVar13 + 4;
          if (pbVar1 + -0x40 <= dest) goto LAB_0011315c;
          if (uVar7 < 8) goto LAB_00112f6c;
          *(undefined8 *)pbVar20 = *(undefined8 *)pbVar15;
          *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)(pbVar15 + 8);
          *(undefined2 *)(pbVar20 + 0x10) = *(undefined2 *)(pbVar15 + 0x10);
        }
        uVar13 = 0;
        do {
          uVar4 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar13 = (ulong)((int)uVar13 + (uint)(byte)uVar4);
        } while ((byte)uVar4 == 0xff);
        dest = (char *)(pbVar20 + uVar13 + 0x13);
        uVar13 = uVar13 + 0x13;
        if (pbVar1 + -0x40 <= dest) goto LAB_0011315c;
        if (uVar7 < 0x10) break;
        do {
          uVar3 = *(undefined8 *)(pbVar20 + -uVar9 + 8);
          *(undefined8 *)pbVar20 = *(undefined8 *)(pbVar20 + -uVar9);
          *(undefined8 *)(pbVar20 + 8) = uVar3;
          uVar3 = *(undefined8 *)(pbVar20 + -uVar9 + 0x10 + 8);
          *(undefined8 *)(pbVar20 + 0x10) = *(undefined8 *)(pbVar20 + -uVar9 + 0x10);
          *(undefined8 *)(pbVar20 + 0x18) = uVar3;
          pbVar20 = pbVar20 + 0x20;
        } while (pbVar20 < dest);
      }
LAB_00112f6c:
      dest = (char *)(pbVar20 + uVar13);
      if (uVar9 == 4) {
        iVar8 = *(int *)pbVar15;
      }
      else if (uVar7 == 2) {
        iVar8 = CONCAT22(*(undefined2 *)pbVar15,*(undefined2 *)pbVar15);
      }
      else {
        if (uVar7 != 1) {
          if (uVar7 < 8) {
            pbVar20[0] = 0;
            pbVar20[1] = 0;
            pbVar20[2] = 0;
            pbVar20[3] = 0;
            *pbVar20 = *pbVar15;
            pbVar20[1] = pbVar15[1];
            pbVar20[2] = pbVar15[2];
            pbVar20[3] = pbVar15[3];
            uVar6 = inc32table[uVar7];
            *(undefined4 *)(pbVar20 + 4) = *(undefined4 *)(pbVar15 + uVar6);
            pbVar15 = pbVar15 + ((ulong)uVar6 - (long)dec64table[uVar7]);
          }
          else {
            *(undefined8 *)pbVar20 = *(undefined8 *)pbVar15;
            pbVar15 = pbVar15 + 8;
          }
          pbVar20 = pbVar20 + 8;
          do {
            *(undefined8 *)pbVar20 = *(undefined8 *)pbVar15;
            pbVar20 = pbVar20 + 8;
            pbVar15 = pbVar15 + 8;
          } while (pbVar20 < dest);
          goto LAB_00112e3c;
        }
        iVar8 = (uint)*pbVar15 * 0x1010101;
      }
      *(int *)pbVar20 = iVar8;
      *(int *)(pbVar20 + 4) = iVar8;
      if (8 < uVar13) {
        pbVar20 = pbVar20 + 8;
        do {
          *(int *)pbVar20 = iVar8;
          *(int *)(pbVar20 + 4) = iVar8;
          pbVar20 = pbVar20 + 8;
        } while (pbVar20 < dest);
      }
      goto LAB_00112e3c;
    }
    while( true ) {
      bVar2 = (byte)*(ushort *)source;
      source = (char *)((long)source + 1);
      while( true ) {
        uVar12 = (uint)bVar2;
        __n = (size_t)(uint)(bVar2 >> 4);
        if ((0x8f < uVar12) || (pbVar14 < dest)) break;
        *(undefined8 *)dest = *(undefined8 *)source;
        pbVar20 = (byte *)dest + __n;
        uVar13 = (ulong)(uVar12 & 0xf);
        puVar19 = (ushort *)((long)source + __n);
        uVar7 = *puVar19;
        pbVar15 = pbVar20 + -(ulong)uVar7;
        if (((uVar12 & 0xf) == 0xf) || (uVar7 < 8)) goto LAB_00113138;
        *(undefined8 *)pbVar20 = *(undefined8 *)pbVar15;
        *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)(pbVar15 + 8);
        *(undefined2 *)(pbVar20 + 0x10) = *(undefined2 *)(pbVar15 + 0x10);
        dest = (char *)(pbVar20 + uVar13 + 4);
        bVar2 = *(byte *)((long)source + __n + 2);
        source = (char *)((long)source + __n + 3);
      }
      if (bVar2 >> 4 == 0xf) {
        uVar6 = 0;
        do {
          uVar7 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar6 = uVar6 + (byte)uVar7;
        } while ((byte)uVar7 == 0xff);
        __n = (ulong)uVar6 + 0xf;
      }
      pbVar20 = (byte *)dest + __n;
LAB_00113104:
      puVar19 = (ushort *)source;
      if (pbVar17 < pbVar20) break;
      do {
        *(undefined8 *)dest = *(undefined8 *)puVar19;
        dest = (char *)((byte *)dest + 8);
        puVar19 = puVar19 + 4;
      } while (dest < pbVar20);
      puVar19 = (ushort *)((long)source + __n);
      uVar7 = *puVar19;
      pbVar15 = pbVar20 + -(ulong)uVar7;
      uVar13 = (ulong)(uVar12 & 0xf);
LAB_00113138:
      source = (char *)(puVar19 + 1);
      if ((int)uVar13 == 0xf) {
        uVar6 = 0;
        do {
          uVar4 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar6 = uVar6 + (byte)uVar4;
        } while ((byte)uVar4 == 0xff);
        uVar13 = (ulong)uVar6 + 0xf;
      }
      uVar13 = uVar13 + 4;
LAB_0011315c:
      dest = (char *)(pbVar20 + uVar13);
      if (uVar7 < 8) {
        LZ4_decompress_fast_cold_1();
        pbVar15 = local_38;
      }
      else {
        *(undefined8 *)pbVar20 = *(undefined8 *)pbVar15;
        pbVar15 = pbVar15 + 8;
      }
      pbVar5 = pbVar20 + 8;
      if (pbVar1 + -0xc < dest) {
        if (pbVar1 + -5 < dest) goto LAB_001131c7;
        pbVar20 = pbVar1 + -7;
        pbVar10 = pbVar15;
        pbVar16 = pbVar5;
        if (pbVar5 < pbVar20) {
          do {
            *(undefined8 *)pbVar16 = *(undefined8 *)pbVar10;
            pbVar16 = pbVar16 + 8;
            pbVar10 = pbVar10 + 8;
          } while (pbVar16 < pbVar20);
          pbVar15 = pbVar15 + ((long)pbVar20 - (long)pbVar5);
          pbVar5 = pbVar20;
        }
        for (; pbVar5 < dest; pbVar5 = pbVar5 + 1) {
          bVar2 = *pbVar15;
          pbVar15 = pbVar15 + 1;
          *pbVar5 = bVar2;
        }
      }
      else {
        *(undefined8 *)pbVar5 = *(undefined8 *)pbVar15;
        if (0x10 < uVar13) {
          pbVar20 = pbVar20 + 0x10;
          do {
            pbVar15 = pbVar15 + 8;
            *(undefined8 *)pbVar20 = *(undefined8 *)pbVar15;
            pbVar20 = pbVar20 + 8;
          } while (pbVar20 < dest);
        }
      }
    }
    if (pbVar20 == pbVar1) {
      memmove(dest,source,__n);
      return ((int)source + (int)__n) - iVar11;
    }
LAB_001131c7:
    uVar6 = ~(uint)source + iVar11;
  }
  return uVar6;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_fast(const char* source, char* dest, int originalSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, withPrefix64k,
                                  (BYTE*)dest - 64 KB, NULL, 0);
}